

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>
               (Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false>_>
                *mb)

{
  bool bVar1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  undefined4 local_198 [2];
  undefined8 local_190;
  shared_count sStack_188;
  char *local_180;
  char *local_178;
  undefined **local_170;
  undefined1 local_168;
  undefined8 *local_160;
  char **local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  Gudhi::persistence_matrix::
  RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false>_>_>
  ::update_representative_cycles(&(mb->matrix_).super_RU_representative_cycles_option);
  pvVar2 = Gudhi::persistence_matrix::
           RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false>_>_>
           ::get_representative_cycles(&(mb->matrix_).super_RU_representative_cycles_option);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x9c7);
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_001b40f0;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_158 = (char **)0x176204;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)(pvVar2->
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar2->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_198[0] = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_170,&local_60,0x9c7,1,2,&tmp,"cycles.size()",local_198,"5");
  tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170 = (undefined **)((ulong)local_170 & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&tmp,(uint *)&local_170);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x9cc);
  bVar1 = std::operator==((pvVar2->
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,&tmp);
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_180 = "cycles[0] == tmp";
  local_178 = "";
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_001b42f0;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_158 = &local_180;
  local_198[0]._0_1_ = bVar1;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_188);
  *tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x9ce);
  local_198[0]._0_1_ =
       std::operator==((pvVar2->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1,&tmp);
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_180 = "cycles[1] == tmp";
  local_178 = "";
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_001b42f0;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_158 = &local_180;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_188);
  *tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x9d0);
  local_198[0]._0_1_ =
       std::operator==((pvVar2->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 2,&tmp);
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_180 = "cycles[2] == tmp";
  local_178 = "";
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_001b42f0;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_158 = &local_180;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_188);
  *tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  local_170._0_4_ = 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&tmp,(uint *)&local_170);
  local_170 = (undefined **)CONCAT44(local_170._4_4_,5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&tmp,(uint *)&local_170);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x9d4);
  local_198[0]._0_1_ =
       std::operator==((pvVar2->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 3,&tmp);
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_180 = "cycles[3] == tmp";
  local_178 = "";
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_001b42f0;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_158 = &local_180;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_188);
  if (tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_170 = (undefined **)CONCAT44(local_170._4_4_,7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&tmp,(uint *)&local_170);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x9d7);
  bVar1 = std::operator==((pvVar2->
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4,&tmp);
  local_198[0] = CONCAT31(local_198[0]._1_3_,bVar1);
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_180 = "cycles[4] == tmp";
  local_178 = "";
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_001b42f0;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_158 = &local_180;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_188);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void test_representative_cycles(Matrix& mb) {
  mb.update_representative_cycles();

  const auto& cycles = mb.get_representative_cycles();
  BOOST_CHECK_EQUAL(cycles.size(), 5);

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    std::vector<unsigned int> tmp;
    tmp.push_back(0);
    BOOST_CHECK(cycles[0] == tmp);
    tmp[0] = 1;
    BOOST_CHECK(cycles[1] == tmp);
    tmp[0] = 2;
    BOOST_CHECK(cycles[2] == tmp);
    tmp[0] = 3;
    tmp.push_back(4);
    tmp.push_back(5);
    BOOST_CHECK(cycles[3] == tmp);
    tmp.clear();
    tmp.push_back(7);
    BOOST_CHECK(cycles[4] == tmp);
  } else {
    std::vector<unsigned int> tmp;
    tmp.push_back(0);
    BOOST_CHECK(cycles[0] == tmp);
    tmp.push_back(1);
    BOOST_CHECK(cycles[1] == tmp);
    tmp[1] = 2;
    BOOST_CHECK(cycles[2] == tmp);
    tmp[0] = 3;
    tmp[1] = 4;
    tmp.push_back(5);
    BOOST_CHECK(cycles[3] == tmp);
    tmp[0] = 0;
    tmp[1] = 7;
    tmp.pop_back();
    BOOST_CHECK(cycles[4] == tmp);
  }

  if constexpr (Matrix::Option_list::has_column_pairings) {
    const auto& barcode = mb.get_current_barcode();
    auto it = barcode.begin();
    for (auto& cycle : cycles) {
      BOOST_CHECK(cycle == mb.get_representative_cycle(*it));
      ++it;
    }
  }
}